

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O2

void __thiscall FIX44::MarketDataRequest::NoRelatedSym::NoRelatedSym(NoRelatedSym *this)

{
  message_order local_38 [8];
  shared_array<int> local_30 [24];
  
  FIX::message_order::message_order
            (local_38,0x37,0x41,0x30,0x16,0x1cc,0x1cd,0xa7,0x2fa,200,0x21d,0xc9,0xe0,0xe1,0xef,0xe2,
             0xe3,0xe4,0xff,0x21f,0x1d6,0x1d7,0x1d8,0xf0,0xca,0x3b3,0xce,0xe7,0xdf,0xcf,0x6a,0x15c,
             0x15d,0x6b,0x15e,0x15f,0x2b3,0x29b,0x36b,0x36c,0x369,0x36a,0x2c7,0x22b,0);
  FIX::Group::Group(&this->super_Group,0x92,0x37,local_38);
  FIX::shared_array<int>::~shared_array(local_30);
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00159078;
  return;
}

Assistant:

NoRelatedSym() : FIX::Group(146,55,FIX::message_order(55,65,48,22,460,461,167,762,200,541,201,224,225,239,226,227,228,255,543,470,471,472,240,202,947,206,231,223,207,106,348,349,107,350,351,691,667,875,876,873,874,711,555,0)) {}